

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O1

void libtorrent::heterogeneous_queue<libtorrent::alert>::move<libtorrent::picker_log_alert>
               (char *dst,char *src)

{
  int *piVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  
  torrent_alert::torrent_alert((torrent_alert *)dst,(torrent_alert *)src);
  *(undefined ***)dst = &PTR__torrent_alert_00460080;
  uVar6 = *(undefined8 *)(src + 0x50);
  uVar7 = *(undefined8 *)(src + 0x58);
  uVar8 = *(undefined8 *)(src + 100);
  *(undefined8 *)(dst + 0x5c) = *(undefined8 *)(src + 0x5c);
  *(undefined8 *)(dst + 100) = uVar8;
  *(undefined8 *)(dst + 0x50) = uVar6;
  *(undefined8 *)(dst + 0x58) = uVar7;
  uVar6 = *(undefined8 *)(src + 0x74);
  *(undefined8 *)(dst + 0x6c) = *(undefined8 *)(src + 0x6c);
  *(undefined8 *)(dst + 0x74) = uVar6;
  *(undefined4 *)(dst + 0x7c) = *(undefined4 *)(src + 0x7c);
  uVar3 = *(undefined4 *)(src + 0x84);
  uVar4 = *(undefined4 *)(src + 0x88);
  uVar5 = *(undefined4 *)(src + 0x8c);
  uVar6 = *(undefined8 *)(src + 0x8c);
  uVar7 = *(undefined8 *)(src + 0x94);
  *(undefined4 *)(dst + 0x80) = *(undefined4 *)(src + 0x80);
  *(undefined4 *)(dst + 0x84) = uVar3;
  *(undefined4 *)(dst + 0x88) = uVar4;
  *(undefined4 *)(dst + 0x8c) = uVar5;
  *(undefined8 *)(dst + 0x8c) = uVar6;
  *(undefined8 *)(dst + 0x94) = uVar7;
  *(undefined ***)dst = &PTR__torrent_alert_00461a28;
  *(undefined8 *)(dst + 0x9c) = *(undefined8 *)(src + 0x9c);
  *(undefined4 *)(dst + 0xa4) = *(undefined4 *)(src + 0xa4);
  *(undefined ***)src = &PTR__torrent_alert_00460038;
  if (*(long **)(src + 0x30) != (long *)(src + 0x40)) {
    operator_delete(*(long **)(src + 0x30),*(long *)(src + 0x40) + 1);
  }
  plVar2 = *(long **)(src + 0x18);
  if (plVar2 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar2 + 0xc);
      iVar9 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar9 = *(int *)((long)plVar2 + 0xc);
      *(int *)((long)plVar2 + 0xc) = iVar9 + -1;
    }
    if (iVar9 == 1) {
      (**(code **)(*plVar2 + 0x18))();
    }
  }
  alert::~alert((alert *)src);
  return;
}

Assistant:

static void move(char* dst, char* src) noexcept
		{
			static_assert(std::is_nothrow_move_constructible<U>::value
				, "heterogeneous queue only supports noexcept move constructible types");
			static_assert(std::is_nothrow_destructible<U>::value
				, "heterogeneous queue only supports noexcept destructible types");
			U& rhs = *reinterpret_cast<U*>(src);

			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(dst) & (alignof(U) - 1)) == 0);

			new (dst) U(std::move(rhs));
			rhs.~U();
		}